

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::IdleDecommitPageAllocator::Prime(IdleDecommitPageAllocator *this,uint primePageCount)

{
  PageSegmentBase<Memory::VirtualAllocWrapper> *this_00;
  
  if ((this->super_PageAllocator).freePageCount < (ulong)primePageCount) {
    do {
      this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::AddPageSegment(&this->super_PageAllocator,
                                 &(this->super_PageAllocator).emptySegments);
      if (this_00 == (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0) {
        return;
      }
      PageSegmentBase<Memory::VirtualAllocWrapper>::Prime(this_00);
    } while ((this->super_PageAllocator).freePageCount < (ulong)primePageCount);
  }
  return;
}

Assistant:

void
IdleDecommitPageAllocator::Prime(uint primePageCount)
{
    while (this->freePageCount < primePageCount)
    {
        PageSegment * segment = AddPageSegment(emptySegments);
        if (segment == nullptr)
        {
            return;
        }
        segment->Prime();
    }
}